

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O0

void makefilename_setup(void)

{
  _class *c;
  t_symbol *ptVar1;
  
  ptVar1 = gensym("makefilename");
  makefilename_class = class_new(ptVar1,makefilename_new,(t_method)0x0,0x40,0,A_DEFSYM,0);
  class_doaddfloat(makefilename_class,makefilename_float);
  class_addsymbol(makefilename_class,makefilename_symbol);
  class_addbang(makefilename_class,makefilename_bang);
  c = makefilename_class;
  ptVar1 = gensym("set");
  class_addmethod(c,makefilename_set,ptVar1,A_SYMBOL,0);
  return;
}

Assistant:

static void makefilename_setup(void)
{
    makefilename_class = class_new(gensym("makefilename"),
    (t_newmethod)makefilename_new, 0,
        sizeof(t_makefilename), 0, A_DEFSYM, 0);
    class_addfloat(makefilename_class, makefilename_float);
    class_addsymbol(makefilename_class, makefilename_symbol);
    class_addbang(makefilename_class, makefilename_bang);
    class_addmethod(makefilename_class, (t_method)makefilename_set,
        gensym("set"), A_SYMBOL, 0);
}